

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstring.h
# Opt level: O2

int __thiscall FSkillInfo::GetTextColor(FSkillInfo *this)

{
  EColorRange EVar1;
  BYTE *cp;
  
  cp = (BYTE *)(this->TextColor).Chars;
  if (*(int *)(cp + -0xc) != 0) {
    EVar1 = V_ParseFontColor(&cp,0,0);
    if (EVar1 == CR_UNDEFINED) {
      Printf("Undefined color \'%s\' in definition of skill %s\n",(this->TextColor).Chars,
             FName::NameData.NameArray[(this->Name).Index].Text);
      EVar1 = CR_UNTRANSLATED;
    }
    return EVar1;
  }
  return 0xb;
}

Assistant:

const FStringData *Data() const { return (FStringData *)Chars - 1; }